

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_perf_strided.c
# Opt level: O0

int trueEverywhere(int flag)

{
  uint uVar1;
  int in_EDI;
  int nprocs;
  int tflag;
  int in_stack_ffffffffffffffec;
  uint uVar2;
  uint local_4;
  
  uVar2 = (uint)(in_EDI != 0);
  uVar1 = GA_Nnodes();
  GA_Igop((int *)CONCAT44(uVar2,uVar1),in_stack_ffffffffffffffec,(char *)0x103900);
  local_4 = (uint)(uVar1 == uVar2);
  return local_4;
}

Assistant:

int trueEverywhere(int flag)
{
  int tflag, nprocs;
  if (flag) tflag = 1;
  else tflag = 0;
  nprocs = GA_Nnodes();
  GA_Igop(&tflag,1,"+");
  if (nprocs == tflag) return 1;
  return 0;
}